

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O0

void __thiscall
duckdb::SQLLogicTestRunner::SQLLogicTestRunner(SQLLogicTestRunner *this,string *dbpath)

{
  DBConfig DVar1;
  pointer pDVar2;
  char *pcVar3;
  string *in_RSI;
  undefined8 *in_RDI;
  char *verify_vector;
  char *env_var;
  undefined8 in_stack_fffffffffffffd68;
  undefined1 __i;
  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true> *puVar4;
  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>
  *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  hasher *in_stack_fffffffffffffd80;
  size_type in_stack_fffffffffffffd88;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd90;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd98;
  allocator_type *in_stack_fffffffffffffdb0;
  string *local_1e0;
  string *local_198;
  undefined1 local_e6 [14];
  string local_d8 [32];
  string local_b8 [32];
  string *local_98;
  undefined8 local_90;
  undefined1 local_7e;
  allocator local_7d [20];
  allocator local_69;
  string *local_68;
  string local_60 [32];
  string local_40 [32];
  string *local_20;
  undefined8 local_18;
  
  __i = (undefined1)((ulong)in_stack_fffffffffffffd68 >> 0x38);
  *in_RDI = &PTR_LoadDatabase_00a23e60;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)0x7c759f);
  unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::unique_ptr
            ((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true> *)0x7c75b8);
  unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::unique_ptr
            ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
             0x7c75d1);
  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::unique_ptr
            ((unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true> *)0x7c75ea);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x7c7603);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>_>_>_>
                   *)0x7c761f);
  *(undefined1 *)(in_RDI + 0x19) = 0;
  *(undefined1 *)((long)in_RDI + 0xc9) = 0;
  *(undefined1 *)((long)in_RDI + 0xca) = 0;
  std::atomic<bool>::atomic((atomic<bool> *)in_stack_fffffffffffffd70,(bool)__i);
  *(undefined4 *)((long)in_RDI + 0xcc) = 0;
  vector<duckdb::LoopCommand_*,_true>::vector((vector<duckdb::LoopCommand_*,_true> *)0x7c7670);
  unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>::unique_ptr
            ((unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true> *)0x7c768c);
  *(undefined1 *)(in_RDI + 0x1e) = 0;
  *(undefined1 *)((long)in_RDI + 0xf1) = 0;
  *(undefined1 *)((long)in_RDI + 0xf2) = 0;
  *(undefined1 *)((long)in_RDI + 0xf3) = 0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x7c76c4);
  std::__cxx11::string::string((string *)(in_RDI + 0x26));
  local_7e = 1;
  local_68 = local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"HTTP",&local_69);
  local_68 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Unable to connect",local_7d);
  local_7e = 0;
  local_20 = local_60;
  local_18 = 2;
  Catch::clara::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x7c77cd);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(in_stack_fffffffffffffd90,in_stack_fffffffffffffd98,in_stack_fffffffffffffd88,
                  in_stack_fffffffffffffd80,
                  (key_equal *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                  in_stack_fffffffffffffdb0);
  Catch::clara::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x7c781b);
  local_198 = (string *)&local_20;
  do {
    local_198 = local_198 + -0x20;
    std::__cxx11::string::~string(local_198);
  } while (local_198 != local_60);
  std::allocator<char>::~allocator((allocator<char> *)local_7d);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_e6[3] = 1;
  local_e6._6_8_ = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"differs from original result!",(allocator *)(local_e6 + 5))
  ;
  local_e6._6_8_ = local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"INTERNAL",(allocator *)(local_e6 + 4));
  local_e6[3] = 0;
  local_98 = local_d8;
  local_90 = 2;
  puVar4 = (unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true> *)local_e6;
  Catch::clara::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x7c7974);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(in_stack_fffffffffffffd90,in_stack_fffffffffffffd98,in_stack_fffffffffffffd88,
                  in_stack_fffffffffffffd80,
                  (key_equal *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                  in_stack_fffffffffffffdb0);
  Catch::clara::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x7c79c2);
  local_1e0 = (string *)&local_98;
  do {
    local_1e0 = local_1e0 + -0x20;
    std::__cxx11::string::~string(local_1e0);
  } while (local_1e0 != local_d8);
  std::allocator<char>::~allocator((allocator<char> *)(local_e6 + 4));
  std::allocator<char>::~allocator((allocator<char> *)(local_e6 + 5));
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x7c7a4a);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>_>
                   *)0x7c7a66);
  std::mutex::mutex((mutex *)0x7c7a7a);
  GetTestConfig();
  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator=
            (in_stack_fffffffffffffd70,puVar4);
  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::~unique_ptr
            ((unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true> *)0x7c7abf);
  pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                     (in_stack_fffffffffffffd70);
  pDVar2[0x172] = (DBConfig)0x1;
  pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                     (in_stack_fffffffffffffd70);
  pDVar2[0xe1] = (DBConfig)0x0;
  pcVar3 = getenv("LOCAL_EXTENSION_REPO");
  if (pcVar3 == (char *)0x0) {
    pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (in_stack_fffffffffffffd70);
    pDVar2[0xe2] = (DBConfig)0x0;
  }
  else {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x26),pcVar3);
    pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (in_stack_fffffffffffffd70);
    pDVar2[0xe2] = (DBConfig)0x1;
  }
  pcVar3 = getenv("DUCKDB_DEBUG_VERIFY_VECTOR");
  if (pcVar3 != (char *)0x0) {
    DVar1 = (DBConfig)duckdb::EnumUtil::FromString<duckdb::DebugVectorVerification>(pcVar3);
    pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (in_stack_fffffffffffffd70);
    pDVar2[0x461] = DVar1;
  }
  return;
}

Assistant:

SQLLogicTestRunner::SQLLogicTestRunner(string dbpath) : dbpath(std::move(dbpath)), finished_processing_file(false) {
	config = GetTestConfig();
	config->options.allow_unredacted_secrets = true;
	config->options.load_extensions = false;

	auto env_var = std::getenv("LOCAL_EXTENSION_REPO");
	if (!env_var) {
		config->options.autoload_known_extensions = false;
	} else {
		local_extension_repo = env_var;
		config->options.autoload_known_extensions = true;
	}
	auto verify_vector = std::getenv("DUCKDB_DEBUG_VERIFY_VECTOR");
	if (verify_vector) {
		config->options.debug_verify_vector = EnumUtil::FromString<DebugVectorVerification>(verify_vector);
	}
}